

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalNinjaGenerator::CheckNinjaFeatures(cmGlobalNinjaGenerator *this)

{
  bool bVar1;
  int iVar2;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  unsigned_long local_e0;
  unsigned_long dyndep;
  char *fv;
  size_type pos;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_30;
  cmGlobalNinjaGenerator *local_10;
  cmGlobalNinjaGenerator *this_local;
  
  local_10 = this;
  RequiredNinjaVersionForConsolePool_abi_cxx11_();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,&this->NinjaVersion,&local_30);
  this->NinjaSupportsConsolePool = (bool)(~bVar1 & 1);
  std::__cxx11::string::~string((string *)&local_30);
  RequiredNinjaVersionForImplicitOuts_abi_cxx11_();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,&this->NinjaVersion,&local_60);
  this->NinjaSupportsImplicitOuts = (bool)(~bVar1 & 1);
  std::__cxx11::string::~string((string *)&local_60);
  RequiredNinjaVersionForManifestRestat_abi_cxx11_();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,&this->NinjaVersion,&local_80);
  this->NinjaSupportsManifestRestat = (bool)(~bVar1 & 1);
  std::__cxx11::string::~string((string *)&local_80);
  RequiredNinjaVersionForMultilineDepfile_abi_cxx11_();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,&this->NinjaVersion,&local_a0);
  this->NinjaSupportsMultilineDepfile = (bool)(~bVar1 & 1);
  std::__cxx11::string::~string((string *)&local_a0);
  RequiredNinjaVersionForDyndeps_abi_cxx11_();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,&this->NinjaVersion,&local_c0);
  this->NinjaSupportsDyndeps = (bool)((bVar1 ^ 0xffU) & 1);
  std::__cxx11::string::~string((string *)&local_c0);
  if ((this->NinjaSupportsDyndeps & 1U) == 0) {
    if ((CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_ == '\0') &&
       (iVar2 = __cxa_guard_acquire(&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_), iVar2 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_,".dyndep-",
                 (allocator<char> *)((long)&pos + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 7));
      __cxa_atexit(std::__cxx11::string::~string,&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_);
    }
    fv = (char *)std::__cxx11::string::find((string *)&this->NinjaVersion,0x1002df8);
    if (fv != (char *)0xffffffffffffffff) {
      std::__cxx11::string::size();
      dyndep = std::__cxx11::string::operator[]((ulong)&this->NinjaVersion);
      local_e0 = 0;
      cmStrToULong((char *)dyndep,&local_e0);
      if (local_e0 == 1) {
        this->NinjaSupportsDyndeps = true;
      }
    }
  }
  RequiredNinjaVersionForUnconditionalRecompactTool_abi_cxx11_();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,&this->NinjaVersion,&local_100);
  this->NinjaSupportsUnconditionalRecompactTool = (bool)(~bVar1 & 1);
  std::__cxx11::string::~string((string *)&local_100);
  RequiredNinjaVersionForRestatTool_abi_cxx11_();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,&this->NinjaVersion,&local_120);
  this->NinjaSupportsRestatTool = (bool)(~bVar1 & 1);
  std::__cxx11::string::~string((string *)&local_120);
  RequiredNinjaVersionForMultipleOutputs_abi_cxx11_();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,&this->NinjaVersion,&local_140);
  this->NinjaSupportsMultipleOutputs = (bool)(~bVar1 & 1);
  std::__cxx11::string::~string((string *)&local_140);
  RequiredNinjaVersionForMetadataOnRegeneration_abi_cxx11_();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,&this->NinjaVersion,&local_160);
  this->NinjaSupportsMetadataOnRegeneration = (bool)((bVar1 ^ 0xffU) & 1);
  std::__cxx11::string::~string((string *)&local_160);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::CheckNinjaFeatures()
{
  this->NinjaSupportsConsolePool =
    !cmSystemTools::VersionCompare(cmSystemTools::OP_LESS, this->NinjaVersion,
                                   RequiredNinjaVersionForConsolePool());
  this->NinjaSupportsImplicitOuts = !cmSystemTools::VersionCompare(
    cmSystemTools::OP_LESS, this->NinjaVersion,
    cmGlobalNinjaGenerator::RequiredNinjaVersionForImplicitOuts());
  this->NinjaSupportsManifestRestat =
    !cmSystemTools::VersionCompare(cmSystemTools::OP_LESS, this->NinjaVersion,
                                   RequiredNinjaVersionForManifestRestat());
  this->NinjaSupportsMultilineDepfile =
    !cmSystemTools::VersionCompare(cmSystemTools::OP_LESS, this->NinjaVersion,
                                   RequiredNinjaVersionForMultilineDepfile());
  this->NinjaSupportsDyndeps =
    !cmSystemTools::VersionCompare(cmSystemTools::OP_LESS, this->NinjaVersion,
                                   RequiredNinjaVersionForDyndeps());
  if (!this->NinjaSupportsDyndeps) {
    // The ninja version number is not new enough to have upstream support.
    // Our ninja branch adds ".dyndep-#" to its version number,
    // where '#' is a feature-specific version number.  Extract it.
    static std::string const k_DYNDEP_ = ".dyndep-";
    std::string::size_type pos = this->NinjaVersion.find(k_DYNDEP_);
    if (pos != std::string::npos) {
      const char* fv = &this->NinjaVersion[pos + k_DYNDEP_.size()];
      unsigned long dyndep = 0;
      cmStrToULong(fv, &dyndep);
      if (dyndep == 1) {
        this->NinjaSupportsDyndeps = true;
      }
    }
  }
  this->NinjaSupportsUnconditionalRecompactTool =
    !cmSystemTools::VersionCompare(
      cmSystemTools::OP_LESS, this->NinjaVersion,
      RequiredNinjaVersionForUnconditionalRecompactTool());
  this->NinjaSupportsRestatTool =
    !cmSystemTools::VersionCompare(cmSystemTools::OP_LESS, this->NinjaVersion,
                                   RequiredNinjaVersionForRestatTool());
  this->NinjaSupportsMultipleOutputs =
    !cmSystemTools::VersionCompare(cmSystemTools::OP_LESS, this->NinjaVersion,
                                   RequiredNinjaVersionForMultipleOutputs());
  this->NinjaSupportsMetadataOnRegeneration = !cmSystemTools::VersionCompare(
    cmSystemTools::OP_LESS, this->NinjaVersion,
    RequiredNinjaVersionForMetadataOnRegeneration());
#ifdef _WIN32
  this->NinjaSupportsCodePage =
    !cmSystemTools::VersionCompare(cmSystemTools::OP_LESS, this->NinjaVersion,
                                   RequiredNinjaVersionForCodePage());
  if (this->NinjaSupportsCodePage) {
    this->CheckNinjaCodePage();
  } else {
    this->NinjaExpectedEncoding = codecvt::ANSI;
  }
#endif
}